

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix_t Companion_Mat4(Matrix_t sMatrix)

{
  float *pMatrix;
  float *pfVar1;
  float fVar2;
  Matrix_t MVar3;
  float *local_80;
  Matrix_t mat_err;
  int y;
  int x;
  int j;
  int i;
  float *arr_res;
  float arr [3] [3];
  Matrix_t sMatrix_local;
  float *local_10;
  
  pfVar1 = sMatrix.pMatrix;
  memset(&local_80,0,0x10);
  pMatrix = (float *)malloc(0x40);
  if (pMatrix == (float *)0x0) {
    printf("ERROR: Malloc failed!-03");
    local_10 = mat_err.pMatrix;
    sMatrix_local._8_8_ = local_80;
  }
  else {
    sMatrix_local.pMatrix._0_1_ = sMatrix.row;
    if (((uint8_t)sMatrix_local.pMatrix == '\x04') &&
       (sMatrix_local.pMatrix._1_1_ = sMatrix.column, sMatrix_local.pMatrix._1_1_ == '\x04')) {
      for (x = 0; x < 4; x = x + 1) {
        for (y = 0; y < 4; y = y + 1) {
          for (mat_err._12_4_ = 0; (int)mat_err._12_4_ < 4; mat_err._12_4_ = mat_err._12_4_ + 1) {
            mat_err.row = '\0';
            mat_err.column = '\0';
            mat_err._10_2_ = 0;
            for (; (int)mat_err._8_4_ < 4; mat_err._8_4_ = mat_err._8_4_ + 1) {
              if ((mat_err._12_4_ != x) && (mat_err._8_4_ != y)) {
                if ((int)mat_err._8_4_ < y) {
                  if ((int)mat_err._12_4_ < x) {
                    arr[(long)(int)mat_err._8_4_ + -1][(long)(int)mat_err._12_4_ + 1] =
                         pfVar1[(long)(mat_err._8_4_ * 4) + (long)(int)mat_err._12_4_];
                  }
                  else {
                    arr[(long)(int)mat_err._8_4_ + -1][(long)(mat_err._12_4_ + -1) + 1] =
                         pfVar1[(long)(mat_err._8_4_ * 4) + (long)(int)mat_err._12_4_];
                  }
                }
                else if ((int)mat_err._12_4_ < x) {
                  arr[(long)(mat_err._8_4_ + -1) + -1][(long)(int)mat_err._12_4_ + 1] =
                       pfVar1[(long)(mat_err._8_4_ * 4) + (long)(int)mat_err._12_4_];
                }
                else {
                  arr[(long)(mat_err._8_4_ + -1) + -1][(long)(mat_err._12_4_ + -1) + 1] =
                       pfVar1[(long)(mat_err._8_4_ * 4) + (long)(int)mat_err._12_4_];
                }
              }
            }
          }
          if ((x + y) % 2 == 0) {
            MVar3 = Arr2Mat((float *)&arr_res,'\x03','\x03');
            fVar2 = Det3(MVar3);
            pMatrix[(long)(x << 2) + (long)y] = fVar2;
          }
          else {
            MVar3 = Arr2Mat((float *)&arr_res,'\x03','\x03');
            fVar2 = Det3(MVar3);
            pMatrix[(long)(x << 2) + (long)y] = fVar2 * -1.0;
          }
        }
      }
      join_0x00000010_0x00000000_ = Arr2Mat(pMatrix,'\x04','\x04');
    }
    else {
      printf("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!\n");
      local_10 = mat_err.pMatrix;
      sMatrix_local._8_8_ = local_80;
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

Matrix_t Companion_Mat4(Matrix_t sMatrix) //严格意义上讲矩阵是没有代数余子式的，代数余子式属于行列式|A|的元素aij，而非矩阵元素aij
{
	float arr[3][3];
	float *arr_res;
	int i, j, x, y;
	Matrix_t mat_err = {NULL, 0, 0};
	arr_res = (float *)malloc(sizeof(float) * 4 * 4);
	if (arr_res == NULL)
	{
		printf("ERROR: Malloc failed!-03");
		return mat_err;
	}
	if (sMatrix.row == 4 && sMatrix.column == 4) //伴随矩阵用于求矩阵的逆，矩阵有逆的必要条件是矩阵是个方阵
	{
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 4; j++)
			{
				for (x = 0; x < 4; x++)
				{
					for (y = 0; y < 4; y++)
					{
						if (x != i)
						{
							if (y != j)
							{
								if (y < j) //选出矩阵的余子式
								{
									if (x < i)
										arr[y][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
								else
								{
									if (x < i)
										arr[y - 1][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y - 1][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
							}
						}
					}
				}
				if ((i + j) % 2 == 0) //计算代数余子式的值并将值存放在结果伴随矩阵的相应位置
					*(arr_res + i * 4 + j) = Det3(Arr2Mat(arr[0], 3, 3));
				else
					*(arr_res + i * 4 + j) = (-1) * Det3(Arr2Mat(arr[0], 3, 3));
			}
		}
		return Arr2Mat(arr_res, 4, 4);
	}
	else
	{
		printf("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}